

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSetLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  TestStatus *pTVar1;
  DeviceInterface *vk;
  VkDevice device;
  Unique<vk::Handle<(vk::HandleType)19>_> obj2;
  Unique<vk::Handle<(vk::HandleType)19>_> obj1;
  Unique<vk::Handle<(vk::HandleType)19>_> obj3;
  Resources res;
  Unique<vk::Handle<(vk::HandleType)19>_> obj0;
  Environment env;
  VkDescriptorSetLayoutCreateInfo local_178;
  Move<vk::Handle<(vk::HandleType)19>_> local_158;
  Move<vk::Handle<(vk::HandleType)19>_> local_138;
  TestStatus *local_110;
  Move<vk::Handle<(vk::HandleType)19>_> local_108;
  Resources local_e8;
  VkDescriptorSetLayout local_a8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_a0;
  Move<vk::Handle<(vk::HandleType)19>_> local_88;
  Environment local_68;
  
  local_68.vkp = context->m_platformInterface;
  local_110 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  local_68.vkd = vk;
  device = Context::getDevice(context);
  local_68.device = device;
  local_68.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_68.programBinaries = context->m_progCollection;
  local_68.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_68.maxResourceConsumers = 4;
  DescriptorSetLayout::Resources::Resources(&local_e8,&local_68,params);
  local_178.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_178.pNext = (void *)0x0;
  local_178.flags = 0;
  local_178.pBindings =
       local_e8.bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_e8.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_e8.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    local_178.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
  }
  local_178.bindingCount =
       (int)((ulong)((long)local_e8.bindings.
                           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e8.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  ::vk::createDescriptorSetLayout(&local_138,vk,device,&local_178,(VkAllocationCallbacks *)0x0);
  local_a8.m_internal =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  DStack_a0.m_deviceIface =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  DStack_a0.m_device =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  DStack_a0.m_allocator =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_178.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_178.pNext = (void *)0x0;
  local_178.flags = 0;
  local_178.pBindings =
       local_e8.bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_e8.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_e8.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    local_178.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
  }
  local_178.bindingCount =
       (int)((ulong)((long)local_e8.bindings.
                           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e8.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  ::vk::createDescriptorSetLayout(&local_158,vk,device,&local_178,(VkAllocationCallbacks *)0x0);
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_178.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_178.pNext = (void *)0x0;
  local_178.flags = 0;
  local_178.pBindings =
       local_e8.bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_e8.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_e8.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    local_178.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
  }
  local_178.bindingCount =
       (int)((ulong)((long)local_e8.bindings.
                           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e8.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  ::vk::createDescriptorSetLayout(&local_108,vk,device,&local_178,(VkAllocationCallbacks *)0x0);
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_178.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_178.pNext = (void *)0x0;
  local_178.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
  if ((long)local_e8.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_e8.bindings.
            super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_178.pBindings =
         local_e8.bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_178.flags = 0;
  local_178.bindingCount =
       (int)((ulong)((long)local_e8.bindings.
                           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e8.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  ::vk::createDescriptorSetLayout
            (&local_88,local_68.vkd,local_68.device,&local_178,local_68.allocationCallbacks);
  pTVar1 = local_110;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&local_108.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
               (VkDescriptorSetLayout)
               local_88.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  }
  if (local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
               (VkDescriptorSetLayout)
               local_158.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  }
  if (local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
               (VkDescriptorSetLayout)
               local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  }
  if (local_a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_a0,local_a8);
  }
  local_178._0_8_ = (void *)((long)&local_178 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Ok","");
  pTVar1->m_code = QP_TEST_RESULT_PASS;
  (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar1->m_description,local_178._0_8_,
             (long)local_178.pNext + local_178._0_8_);
  if ((void *)local_178._0_8_ != (void *)((long)&local_178 + 0x10U)) {
    operator_delete((void *)local_178._0_8_,CONCAT44(local_178.bindingCount,local_178.flags) + 1);
  }
  if (local_e8.immutableSamplersPtr.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.immutableSamplersPtr.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.immutableSamplersPtr.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.immutableSamplersPtr.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  de::details::
  UniqueBase<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>_>_>
  ::reset(&local_e8.immutableSampler.
           super_UniqueBase<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::Sampler>_>_>
         );
  if (local_e8.bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkDescriptorSetLayoutBinding *)0x0) {
    operator_delete(local_e8.bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}